

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save_attachment_to_file.c
# Opt level: O3

void usage(void)

{
  putchar(10);
  puts("libcmime - simple api demonstration");
  puts("-----------------------------------");
  puts(
      "demonstrates: save CMimePart_T part of CMimeMessage_T object with cmime_part_to_file() to a file"
      );
  puts("required parameter: -i /path/to/in_file");
  puts("optional parameter: -o /path/to/out_file");
  return;
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: save CMimePart_T part of CMimeMessage_T object with cmime_part_to_file() to a file\n");
    printf("required parameter: -i /path/to/in_file\n");
    printf("optional parameter: -o /path/to/out_file\n");
}